

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O2

void __thiscall CTextRender::TextAdvance(CTextRender *this,CTextCursor *pCursor,float AdvanceX)

{
  int iVar1;
  IGraphics *pIVar2;
  long in_FS_OFFSET;
  uint uVar3;
  float fVar4;
  float fVar5;
  float ScreenY1;
  float ScreenX1;
  float ScreenY0;
  float ScreenX0;
  undefined1 local_40 [4];
  float local_3c;
  undefined1 local_38 [4];
  float local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar2 = this->m_pGraphics;
  iVar1 = pIVar2->m_ScreenWidth;
  (*(pIVar2->super_IInterface)._vptr_IInterface[6])(pIVar2,&local_34,local_38,&local_3c,local_40);
  uVar3 = -(uint)(pCursor->m_MaxWidth < 0.0);
  fVar4 = (float)(~uVar3 & (uint)pCursor->m_MaxWidth | uVar3 & 0x7f800000);
  fVar5 = (float)(int)(AdvanceX + (pCursor->m_Advance).field_0.x);
  if (fVar4 < fVar5) {
    (*(this->super_IEngineTextRender).super_ITextRender.super_IInterface._vptr_IInterface[8])
              (this,pCursor);
    fVar5 = fVar5 - fVar4;
  }
  fVar4 = (float)iVar1 / (local_3c - local_34);
  (pCursor->m_Advance).field_0.x = (float)(int)(fVar5 * fVar4) / fVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTextRender::TextAdvance(CTextCursor *pCursor, float AdvanceX)
{
	// Alignment
	float ScreenX0, ScreenY0, ScreenX1, ScreenY1;
	int ScreenWidth = Graphics()->ScreenWidth();
	int ScreenHeight = Graphics()->ScreenHeight();
	Graphics()->GetScreen(&ScreenX0, &ScreenY0, &ScreenX1, &ScreenY1);

	vec2 ScreenScale = vec2(ScreenWidth/(ScreenX1-ScreenX0), ScreenHeight/(ScreenY1-ScreenY0));

	int LineWidth = pCursor->m_Advance.x + AdvanceX;
	float MaxWidth = pCursor->m_MaxWidth;
	if(MaxWidth < 0)
		MaxWidth = INFINITY;
	if(LineWidth > MaxWidth)
	{
		TextNewline(pCursor);
		pCursor->m_Advance.x = LineWidth - MaxWidth;
	}
	else
	{
		pCursor->m_Advance.x = LineWidth;
	}

	pCursor->m_Advance.x = (int)(pCursor->m_Advance.x * ScreenScale.x) / ScreenScale.x;
}